

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O0

bool __thiscall
MipsElfRelocator::relocateOpcode
          (MipsElfRelocator *this,int type,RelocationData *data,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  bool bVar1;
  string local_60;
  byte local_3d;
  uint local_3c;
  bool result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  uint op;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  vector<RelocationAction,_std::allocator<RelocationAction>_> *actions_local;
  RelocationData *data_local;
  MipsElfRelocator *pMStack_18;
  int type_local;
  MipsElfRelocator *this_local;
  
  local_3c = data->opcode;
  local_3d = 1;
  pvStack_38 = errors;
  errors_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)actions;
  actions_local = (vector<RelocationAction,_std::allocator<RelocationAction>_> *)data;
  data_local._4_4_ = type;
  pMStack_18 = this;
  switch(type) {
  case 2:
    local_3c = (int)data->relocationBase + local_3c;
    break;
  default:
    tinyformat::format<int>
              (&local_60,"Unknown MIPS relocation type %d",(int *)((long)&data_local + 4));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,&local_60
              );
    std::__cxx11::string::~string((string *)&local_60);
    return false;
  case 4:
    local_3c = local_3c & 0xfc000000 |
               (local_3c & 0x3ffffff) + (int)(data->relocationBase >> 2) & 0x3ffffff;
    break;
  case 5:
    std::vector<MipsElfRelocator::Hi16Entry,std::allocator<MipsElfRelocator::Hi16Entry>>::
    emplace_back<long_const&,long_const&,unsigned_int_const&>
              ((vector<MipsElfRelocator::Hi16Entry,std::allocator<MipsElfRelocator::Hi16Entry>> *)
               &this->hi16Entries,&data->opcodeOffset,&data->relocationBase,&data->opcode);
    break;
  case 6:
    bVar1 = processHi16Entries(this,local_3c,data->relocationBase,actions,errors);
    if (!bVar1) {
      local_3d = 0;
    }
    local_3c = local_3c & 0xffff0000 |
               (local_3c & 0xffff) +
               (int)(actions_local->
                    super__Vector_base<RelocationAction,_std::allocator<RelocationAction>_>)._M_impl
                    .super__Vector_impl_data._M_finish & 0xffff;
  }
  std::vector<RelocationAction,std::allocator<RelocationAction>>::
  emplace_back<long_const&,unsigned_int&>
            ((vector<RelocationAction,std::allocator<RelocationAction>> *)errors_local,
             (long *)actions_local,&local_3c);
  return (bool)(local_3d & 1);
}

Assistant:

bool MipsElfRelocator::relocateOpcode(int type, const RelocationData& data, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	unsigned int op = data.opcode;
	bool result = true;

	switch (type)
	{
	case R_MIPS_26: //j, jal
		op = (op & 0xFC000000) | (((op&0x03FFFFFF)+(data.relocationBase>>2))&0x03FFFFFF);
		break;
	case R_MIPS_32:
		op += (int) data.relocationBase;
		break;
	case R_MIPS_HI16:
		hi16Entries.emplace_back(data.opcodeOffset, data.relocationBase, data.opcode);
		break;
	case R_MIPS_LO16:
		if (!processHi16Entries(op, data.relocationBase, actions, errors))
			result = false;
		op = (op&0xffff0000) | (((op&0xffff)+data.relocationBase)&0xffff);
		break;
	default:
		errors.emplace_back(tfm::format("Unknown MIPS relocation type %d",type));
		return false;
	}

	actions.emplace_back(data.opcodeOffset, op);
	return result;
}